

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  time_point local_360;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  time_point local_2e0;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  time_point local_260;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  time_point local_1e0;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  time_point local_160;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  time_point local_e0;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  time_point local_38 [3];
  type local_19;
  thread local_18;
  undefined4 local_c;
  
  local_c = 0;
  FLog::printAll = true;
  FLog::logLevel = all;
  std::thread::thread<main::__0,,void>(&local_18,&local_19);
  std::thread::join();
  std::thread::~thread(&local_18);
  local_38[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"first user",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"main",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Test message log",&local_d1);
  FLog::mUserLog(tVar1,&local_58,0x11,&local_80,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"main",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Test message log",&local_151);
  FLog::mUi(tVar1,0x12,&local_100,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  local_160.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"main",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Test message log",&local_1d1);
  FLog::mError(tVar1,0x13,&local_180,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  local_1e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"main",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Test message log",&local_251);
  FLog::mDatabase(tVar1,0x14,&local_200,&local_228,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  local_260.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"main",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Test message log",&local_2d1);
  FLog::mInfo(tVar1,0x15,&local_280,&local_2a8,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  local_2e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"main",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"Test message log",&local_351);
  FLog::mWarning(tVar1,0x16,&local_300,&local_328,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  local_360.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"main",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_3a9);
  FLog::mfree(tVar1,0x17,&local_380,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  return 0;
}

Assistant:

int main()
{
	// set print level to top ( print all logs )
	FLog::printAll = true;

	// set log level to top ( log every thing )
	FLog::logLevel = FLog::Level::all;
	std::thread([]() {
	FLogUser("first user", "Test message log");

	}).join();

	// using APIs
	FLogUser("first user", "Test message log");
	FLogGui("Test message log");
	FLogerror("Test message log");
	FLogdatabase("Test message log");
	FLoginfo("Test message log");
	FLogwarning("Test message log");
	FLogFree();

	return 0;
}